

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void phosg::print_log_prefix(FILE *stream,LogLevel level)

{
  char cVar1;
  uint uVar2;
  const_reference pvVar3;
  time_t now_secs;
  char time_buffer [32];
  tm now_tm;
  
  now_secs = time((time_t *)0x0);
  localtime_r(&now_secs,(tm *)&now_tm);
  strftime(time_buffer,0x20,"%Y-%m-%d %H:%M:%S",(tm *)&now_tm);
  pvVar3 = ::std::vector<char,_std::allocator<char>_>::at
                     ((vector<char,_std::allocator<char>_> *)log_level_chars,(long)level);
  cVar1 = *pvVar3;
  uVar2 = getpid_cached();
  fprintf((FILE *)stream,"%c %d %s - ",(ulong)(uint)(int)cVar1,(ulong)uVar2,time_buffer);
  return;
}

Assistant:

void print_log_prefix(FILE* stream, LogLevel level) {
  char time_buffer[32];
  time_t now_secs = time(nullptr);
  struct tm now_tm;
  localtime_r(&now_secs, &now_tm);
  strftime(time_buffer, sizeof(time_buffer), "%Y-%m-%d %H:%M:%S", &now_tm);
  char level_char = log_level_chars.at(static_cast<int>(level));
  fprintf(stream, "%c %d %s - ", level_char, getpid_cached(), time_buffer);
}